

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O1

char * stb_to_utf8(char *buffer,stb__wchar *str,int n)

{
  ushort uVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  stb__wchar sVar5;
  uint uVar6;
  
  sVar5 = *str;
  lVar2 = 0;
  if (sVar5 != 0) {
    iVar3 = 0;
    do {
      if (sVar5 < 0x80) {
        if (n + -1 <= iVar3) {
          return (char *)0x0;
        }
        str = str + 1;
        iVar4 = iVar3 + 1;
        buffer[iVar3] = (char)sVar5;
      }
      else {
        if (sVar5 < 0x800) {
          iVar4 = iVar3 + 2;
          if (n <= iVar4) {
            return (char *)0x0;
          }
          buffer[iVar3] = (byte)(sVar5 >> 6) | 0xc0;
          buffer[(long)iVar3 + 1] = (byte)*str & 0x3f | 0x80;
        }
        else {
          if ((sVar5 & 0xfc00) == 0xd800) {
            iVar4 = iVar3 + 4;
            if (n <= iVar4) {
              return (char *)0x0;
            }
            uVar1 = str[1];
            uVar6 = (uint)sVar5 * 0x400 + (uint)uVar1 + 0xfca02400;
            buffer[iVar3] = (char)(uVar6 >> 0x12) + -0x10;
            buffer[(long)iVar3 + 1] = (byte)(uVar6 >> 0xc) & 0x3f | 0x80;
            buffer[(long)iVar3 + 2] = (byte)(uVar6 >> 6) & 0x3f | 0x80;
            buffer[(long)iVar3 + 3] = (byte)uVar1 & 0x3f | 0x80;
            str = str + 2;
            goto LAB_001816c7;
          }
          if ((sVar5 & 0xfc00) == 0xdc00) {
            return (char *)0x0;
          }
          iVar4 = iVar3 + 3;
          if (n <= iVar4) {
            return (char *)0x0;
          }
          buffer[iVar3] = (byte)(sVar5 >> 0xc) | 0xe0;
          buffer[(long)iVar3 + 1] = (byte)(*str >> 6) & 0x3f | 0x80;
          buffer[(long)iVar3 + 2] = (byte)*str & 0x3f | 0x80;
        }
        str = str + 1;
      }
LAB_001816c7:
      sVar5 = *str;
      iVar3 = iVar4;
    } while (sVar5 != 0);
    lVar2 = (long)iVar4;
  }
  buffer[lVar2] = '\0';
  return buffer;
}

Assistant:

char * stb_to_utf8(char *buffer, stb__wchar *str, int n)
{
   int i=0;
   --n;
   while (*str) {
      if (*str < 0x80) {
         if (i+1 > n) return NULL;
         buffer[i++] = (char) *str++;
      } else if (*str < 0x800) {
         if (i+2 > n) return NULL;
         buffer[i++] = 0xc0 + (*str >> 6);
         buffer[i++] = 0x80 + (*str & 0x3f);
         str += 1;
      } else if (*str >= 0xd800 && *str < 0xdc00) {
         stb_uint32 c;
         if (i+4 > n) return NULL;
         c = ((str[0] - 0xd800) << 10) + ((str[1]) - 0xdc00) + 0x10000;
         buffer[i++] = 0xf0 + (c >> 18);
         buffer[i++] = 0x80 + ((c >> 12) & 0x3f);
         buffer[i++] = 0x80 + ((c >>  6) & 0x3f);
         buffer[i++] = 0x80 + ((c      ) & 0x3f);
         str += 2;
      } else if (*str >= 0xdc00 && *str < 0xe000) {
         return NULL;
      } else {
         if (i+3 > n) return NULL;
         buffer[i++] = 0xe0 + (*str >> 12);
         buffer[i++] = 0x80 + ((*str >> 6) & 0x3f);
         buffer[i++] = 0x80 + ((*str     ) & 0x3f);
         str += 1;
      }
   }
   buffer[i] = 0;
   return buffer;
}